

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_dir.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  ALLEGRO_FS_ENTRY *pAVar4;
  undefined8 uVar5;
  char *entry;
  ulong uVar6;
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 != '\0') {
    log_printf("Example of filesystem entry functions:\n\n%-36s %-6s %8s %8s %8s %8s\n","name",
               "flags","ctime","mtime","atime","size");
    log_printf("------------------------------------ ------ -------- -------- -------- --------\n");
    if (argc == 1) {
      pAVar4 = (ALLEGRO_FS_ENTRY *)al_create_fs_entry("data");
      print_entry(pAVar4);
      print_fs_entry(pAVar4);
      print_fs_entry_norecurse(pAVar4);
      al_destroy_fs_entry(pAVar4);
    }
    if (1 < argc) {
      uVar6 = 1;
      do {
        pAVar4 = (ALLEGRO_FS_ENTRY *)al_create_fs_entry(argv[uVar6]);
        print_entry(pAVar4);
        print_fs_entry(pAVar4);
        print_fs_entry_norecurse(pAVar4);
        al_destroy_fs_entry(pAVar4);
        uVar6 = uVar6 + 1;
      } while ((uint)argc != uVar6);
    }
    return 0;
  }
  entry = "Could not init Allegro.\n";
  abort_example("Could not init Allegro.\n");
  print_file((ALLEGRO_FS_ENTRY *)entry);
  uVar2 = al_get_fs_entry_mode(entry);
  if ((uVar2 & 0x20) == 0) {
    return uVar2;
  }
  cVar1 = al_open_directory(entry);
  if (cVar1 != '\0') {
    pAVar4 = (ALLEGRO_FS_ENTRY *)al_read_directory(entry);
    while (pAVar4 != (ALLEGRO_FS_ENTRY *)0x0) {
      print_entry(pAVar4);
      al_destroy_fs_entry(pAVar4);
      pAVar4 = (ALLEGRO_FS_ENTRY *)al_read_directory(entry);
    }
    iVar3 = al_close_directory(entry);
    return iVar3;
  }
  uVar5 = al_get_fs_entry_name(entry);
  log_printf("Error opening directory: %s\n",uVar5);
  return extraout_EAX;
}

Assistant:

int main(int argc, char **argv)
{
   int i;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   open_log_monospace();
   
   log_printf("Example of filesystem entry functions:\n\n%-36s %-6s %8s %8s %8s %8s\n",
      "name", "flags", "ctime", "mtime", "atime", "size");
   log_printf(
      "------------------------------------ "
      "------ "
      "-------- "
      "-------- "
      "-------- "
      "--------\n");

   #ifdef ALLEGRO_ANDROID
   al_android_set_apk_fs_interface();
   #endif

   if (argc == 1) {
      ALLEGRO_FS_ENTRY *entry = al_create_fs_entry("data");
      print_entry(entry);
      print_fs_entry(entry);
      print_fs_entry_norecurse(entry);
      al_destroy_fs_entry(entry);
   }

   for (i = 1; i < argc; i++) {
      ALLEGRO_FS_ENTRY *entry = al_create_fs_entry(argv[i]);
      print_entry(entry);
      print_fs_entry(entry);
      print_fs_entry_norecurse(entry);
      al_destroy_fs_entry(entry);
   }

   close_log(true);
   return 0;
}